

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

void __thiscall SGParser::Generator::Lex::CreateRegExpGrammar(Lex *this,Grammar *grammar)

{
  char *__s;
  Grammar *this_00;
  mapped_type *pmVar1;
  long lVar2;
  size_t j;
  long lVar3;
  size_t *psVar4;
  long lVar5;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  undefined1 local_4e8 [8];
  Production p;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_420;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_380;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_358;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_308;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_290;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_240;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_150;
  undefined1 local_128 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  grammarSymbols;
  key_type local_d8;
  uint local_b8 [2];
  uint arr [4];
  uint local_a0 [16];
  Grammar *local_60;
  undefined1 auStack_58 [8];
  vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  productions;
  uint local_38;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_32;
  allocator_type local_31;
  
  grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[8],_unsigned_int,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_4e8,(char (*) [8])"RegExp\'",
             (uint *)&grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_d8._M_dataplus._M_p._0_4_ = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_unsigned_int,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)&p.Id,(char (*) [7])"RegExp",(uint *)&local_d8);
  auStack_58._0_4_ = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)&p.ReduceOverrides,(char (*) [2])0x140e5e,(uint *)auStack_58);
  local_b8[0] = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)&p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (char (*) [2])"B",local_b8);
  productions.
  super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header,(char (*) [2])0x141f44,
             (uint *)((long)&productions.
                             super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_38 = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_420,(char (*) [2])"D",&local_38);
  arr[2] = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_3f8,(char (*) [2])0x142a2d,arr + 2);
  arr[3] = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[8],_unsigned_int,_true>(&local_3d0,(char (*) [8])0x143a1a,arr + 3);
  local_a0[0] = 9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[9],_unsigned_int,_true>(&local_3a8,(char (*) [9])0x143a03,local_a0);
  local_a0[1] = 0x80000065;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_unsigned_int,_true>(&local_380,(char (*) [10])"character",local_a0 + 1)
  ;
  local_a0[2] = 0x8000002d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_358,(char (*) [2])0x14267f,local_a0 + 2);
  local_a0[3] = 0x80000041;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_330,(char (*) [2])0x142738,local_a0 + 3);
  local_a0[4] = 0x80000030;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_308,(char (*) [2])0x143381,local_a0 + 4);
  local_a0[5] = 0x8000007e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_2e0,(char (*) [2])0x14273e,local_a0 + 5);
  local_a0[6] = 0x8000002c;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_2b8,(char (*) [2])0x1426ac,local_a0 + 6);
  local_a0[7] = 0x8000002a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_290,(char (*) [2])0x142747,local_a0 + 7);
  local_a0[8] = 0x8000002b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_268,(char (*) [2])0x14337d,local_a0 + 8);
  local_a0[9] = 0x8000005d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_240,(char (*) [2])0x1435f3,local_a0 + 9);
  local_a0[10] = 0x8000005f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_218,(char (*) [2])0x142677,local_a0 + 10);
  local_a0[0xb] = 0x8000007d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_1f0,(char (*) [2])0x14109c,local_a0 + 0xb);
  local_a0[0xc] = 0x8000007f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_1c8,(char (*) [2])0x142744,local_a0 + 0xc);
  local_a0[0xd] = 0x8000002f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_1a0,(char (*) [2])"-",local_a0 + 0xd);
  local_a0[0xe] = 0x80000060;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_178,(char (*) [2])"^",local_a0 + 0xe);
  local_a0[0xf] = 0x80000026;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(&local_150,(char (*) [2])"$",local_a0 + 0xf);
  __l._M_len = 0x18;
  __l._M_array = (iterator)local_4e8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_128,__l,&local_32,&local_31);
  lVar2 = 0x398;
  local_60 = grammar;
  do {
    std::__cxx11::string::~string((string *)(local_4e8 + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  productions.
  super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  productions.
  super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lVar5 = 0x15c7e8;
  for (lVar2 = 0; this_00 = local_60,
      psVar4 = &grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count, lVar2 != 0x14;
      lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      __s = *(char **)(lVar5 + lVar3 * 8);
      if (__s != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_4e8,__s,(allocator<char> *)psVar4);
        pmVar1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)local_128,(key_type *)local_4e8);
        local_b8[lVar3] = *pmVar1;
        std::__cxx11::string::~string((string *)local_4e8);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)psVar4,CreateRegExpGrammar::init[lVar2].pName,
               (allocator<char> *)
               ((long)&productions.
                       super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,CreateRegExpGrammar::init[lVar2].pSymbol,
               (allocator<char> *)&local_38);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)local_128,&local_d8);
    psVar4 = &grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count;
    Production::Production
              ((Production *)local_4e8,(String *)psVar4,*pmVar1,local_b8,
               CreateRegExpGrammar::init[lVar2].Length,0,0);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)psVar4);
    std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
    push_back((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
               *)auStack_58,(Production *)local_4e8);
    Production::~Production((Production *)local_4e8);
    lVar5 = lVar5 + 0x38;
  }
  Grammar::Clear(local_60);
  Grammar::AddGrammarSymbols
            (this_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)local_128);
  Grammar::AddProductions
            (this_00,(vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                      *)auStack_58);
  std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
  ~vector((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
           *)auStack_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)local_128);
  return;
}

Assistant:

void Lex::CreateRegExpGrammar(Grammar& grammar) const {
    // Define a grammar. Notice the first production is the "augment"
    // production. You've always got to have it since it tells the
    // parser the start symbol and creates an augmented grammar

    // RegExp'      -> RegExp
    // RegExp       -> RegExp A (concatenation operator is implicit)
    // RegExp       -> A

    // A            -> A '|' B
    // A            -> B

    // B            -> B '*'
    // B            -> B '+'
    // B            -> B '?'
    // B            -> C

    // C            -> '(' RegExp ')'
    // C            -> character
    // C            -> '.'
    // C            -> '[' GroupSet ']'
    // C            -> '[' '^' GroupSet ']'
    // C            -> '{' CharSet '}'

    // GroupSet     -> character '-' character
    // GroupSet     -> character
    // GroupSet     -> character '-' character GroupSet
    // GroupSet     -> character GroupSet

    // CharSet      -> character
    // CharSet      -> CharSet character

    // The terminals are . | * + $ - ^ { } ( ) [ ] character

    std::map<String, unsigned> grammarSymbols =
    {
        // Nonterminals (9 total)
        {"RegExp'",   1u},
        {"RegExp",    2u},
        {"A",         3u},
        {"B",         4u},
        {"C",         5u},
        {"D",         6u},
        {"E",         7u},
        {"CharSet",   8u},
        {"GroupSet",  9u},

        // Terminals (14 total)
        {"character", ('c' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"+",         ('+' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"?",         ('?' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {".",         ('.' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"|",         ('|' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"*",         ('*' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"(",         ('(' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {")",         (')' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"[",         ('[' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"]",         (']' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"{",         ('{' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"}",         ('}' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"-",         ('-' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"^",         ('^' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"$",         ('$' + TokenCode::TokenFirstID) | ProductionMask::Terminal}
    };

    // Productions structure
    static constexpr size_t productionCount = 20u;
    static constexpr struct
    {
        const char* pName;
        const char* pSymbol;
        unsigned    Length;
        const char* pRight[4u];
    }
    init[productionCount] =
    {
        {"RegExpConcat",             "RegExp",   2u, {"RegExp", "A"}                            }, // 0
        {"RegExp",                   "RegExp",   1u, {"A"}                                      }, // 1
        {"AOr",                      "A",        3u, {"A", "|", "B"}                            }, // 2
        {"A",                        "A",        1u, {"B"}                                      }, // 3
        {"BStar",                    "B",        2u, {"B", "*"}                                 }, // 4
        {"BPlus",                    "B",        2u, {"B", "+"}                                 }, // 5
        {"BQuestion",                "B",        2u, {"B", "?"}                                 }, // 6
        {"B",                        "B",        1u, {"C"}                                      }, // 7
        {"CParen",                   "C",        3u, {"(", "RegExp", ")"}                       }, // 8
        {"CChar",                    "C",        1u, {"character"}                              }, // 9
        {"CDot",                     "C",        1u, {"."}                                      }, // 10
        {"CGroupSet",                "C",        3u, {"[", "GroupSet", "]"}                     }, // 11
        {"CNotGroupSet",             "C",        4u, {"[", "^", "GroupSet", "]"}                }, // 12
        {"CCharSet",                 "C",        3u, {"{", "CharSet", "}"}                      }, // 13
        {"GroupSetChar",             "GroupSet", 1u, {"character"}                              }, // 14
        {"GroupSetCharGroupSet",     "GroupSet", 2u, {"character", "GroupSet"}                  }, // 15
        {"GroupSetCharList",         "GroupSet", 3u, {"character", "-", "character"}            }, // 16
        {"GroupSetCharListGroupSet", "GroupSet", 4u, {"character", "-", "character", "GroupSet"}}, // 17
        {"CharSet",                  "CharSet",  1u, {"character"}                              }, // 18
        {"CharSetChar",              "CharSet",  2u, {"CharSet", "character"}                   }  // 19
    };

    std::vector<Production> productions;

    // Create productions
    for (size_t i = 0u; i < productionCount; ++i) {
        unsigned arr[4];
        // Convert names into integers
        for (size_t j = 0u; j < 4u; ++j)
            if (init[i].pRight[j])
                arr[j] = grammarSymbols[init[i].pRight[j]];
        // Add production
        Production p{init[i].pName, grammarSymbols[init[i].pSymbol], arr, init[i].Length};
        productions.push_back(p);
    }

    // And initialize grammar
    grammar.Clear();
    grammar.AddGrammarSymbols(grammarSymbols);
    grammar.AddProductions(productions);
}